

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O2

lzham_compress_status_t
lzham::lzham_lib_compress
          (lzham_compress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  uint uVar1;
  bool bVar2;
  lzham_compress_status_t lVar3;
  ulong uVar4;
  ulong uVar5;
  lzham_compress_state *pState;
  
  if (p == (lzham_compress_state_ptr)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (*(int *)((long)p + 0x5a26e0) == 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pOut_buf_size == (size_t *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pIn_buf_size == (size_t *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (1 < *(uint *)((long)p + 0x5a26f8)) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if ((pIn_buf == (lzham_uint8 *)0x0) && (*pIn_buf_size != 0)) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pOut_buf == (lzham_uint8 *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (*pOut_buf_size == 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  uVar1 = *(uint *)((long)p + 0x3b30);
  if (*(ulong *)((long)p + 0x5a26d0) < (ulong)uVar1) {
    *pIn_buf_size = 0;
    uVar4 = (ulong)uVar1 - *(long *)((long)p + 0x5a26d0);
    if (*pOut_buf_size <= uVar4) {
      uVar4 = *pOut_buf_size;
    }
    *pOut_buf_size = uVar4;
    memcpy(pOut_buf,(void *)(*(long *)((long)p + 0x3b28) + *(long *)((long)p + 0x5a26d0)),uVar4);
    *(long *)((long)p + 0x5a26d0) = *(long *)((long)p + 0x5a26d0) + *pOut_buf_size;
  }
  else {
    vector<unsigned_char>::try_resize((vector<unsigned_char> *)((long)p + 0x3b28),0,false);
    *(undefined8 *)((long)p + 0x5a26d0) = 0;
    uVar4 = *pIn_buf_size;
    if (*(char *)((long)p + 0x5a26d8) == '\x01') {
      if (no_more_input_bytes_flag == 0 || uVar4 != 0) {
        lVar3 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
        goto LAB_0010d2ed;
      }
      *pIn_buf_size = 0;
      *pOut_buf_size = 0;
LAB_0010d1e7:
      lVar3 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
      goto LAB_0010d2ed;
    }
    uVar5 = 0x400000;
    if (uVar4 < 0x400000) {
      uVar5 = uVar4;
    }
    if ((uVar4 != 0) &&
       (bVar2 = lzcompressor::put_bytes((lzcompressor *)((long)p + 0x2c8),pIn_buf,(uint)uVar5),
       !bVar2)) {
LAB_0010d2e1:
      *pIn_buf_size = 0;
      *pOut_buf_size = 0;
      lVar3 = LZHAM_COMP_STATUS_FAILED;
      goto LAB_0010d2ed;
    }
    if ((no_more_input_bytes_flag != 0 && uVar4 < 0x400001) &&
       (*(char *)((long)p + 0x5a26d8) == '\0')) {
      bVar2 = lzcompressor::put_bytes((lzcompressor *)((long)p + 0x2c8),(void *)0x0,0);
      if (!bVar2) goto LAB_0010d2e1;
      *(undefined1 *)((long)p + 0x5a26d8) = 1;
    }
    *pIn_buf_size = uVar5;
    uVar5 = (ulong)*(uint *)((long)p + 0x3b30) - *(long *)((long)p + 0x5a26d0);
    if (*pOut_buf_size <= uVar5) {
      uVar5 = *pOut_buf_size;
    }
    *pOut_buf_size = uVar5;
    if (uVar5 != 0) {
      memcpy(pOut_buf,(void *)(*(long *)((long)p + 0x3b28) + *(long *)((long)p + 0x5a26d0)),uVar5);
      *(long *)((long)p + 0x5a26d0) = *(long *)((long)p + 0x5a26d0) + *pOut_buf_size;
    }
    if (no_more_input_bytes_flag == 0) {
      if ((uVar4 < 0x400001) &&
         ((ulong)*(uint *)((long)p + 0x3b30) <= *(ulong *)((long)p + 0x5a26d0))) {
        lVar3 = LZHAM_COMP_STATUS_NEEDS_MORE_INPUT;
        goto LAB_0010d2ed;
      }
    }
    else if ((*(char *)((long)p + 0x5a26d8) == '\x01') &&
            ((ulong)*(uint *)((long)p + 0x3b30) <= *(ulong *)((long)p + 0x5a26d0)))
    goto LAB_0010d1e7;
  }
  lVar3 = LZHAM_COMP_STATUS_NOT_FINISHED;
LAB_0010d2ed:
  *(lzham_compress_status_t *)((long)p + 0x5a26f8) = lVar3;
  return lVar3;
}

Assistant:

lzham_compress_status_t lzham_lib_compress(
      lzham_compress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size, 
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state*>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (pState->m_status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if ((!*pOut_buf_size) || (!pOut_buf))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      byte_vec &comp_data = pState->m_compressor.get_compressed_data();
      if (pState->m_comp_data_ofs < comp_data.size())
      {
         *pIn_buf_size = 0;
         *pOut_buf_size = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);
                  
         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, *pOut_buf_size);
         
         pState->m_comp_data_ofs += *pOut_buf_size;
         
         pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
         return pState->m_status;
      }
      
      comp_data.try_resize(0);
      pState->m_comp_data_ofs = 0;
      
      if (pState->m_flushed_compressor)
      {
         if ((*pIn_buf_size) || (!no_more_input_bytes_flag))
         {
            pState->m_status = LZHAM_COMP_STATUS_INVALID_PARAMETER;
            return pState->m_status;
         }
         
         *pIn_buf_size = 0;
         *pOut_buf_size = 0;
         
         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
         return pState->m_status;
      }
      
      const size_t cMaxBytesToPutPerIteration = 4*1024*1024;
      size_t bytes_to_put = LZHAM_MIN(cMaxBytesToPutPerIteration, *pIn_buf_size);
      const bool consumed_entire_input_buf = (bytes_to_put == *pIn_buf_size);

      if (bytes_to_put)
      {
         if (!pState->m_compressor.put_bytes(pIn_buf, (uint)bytes_to_put))
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = 0;
            
            pState->m_status = LZHAM_COMP_STATUS_FAILED;
            return pState->m_status;
         }
      }
      
      if ((consumed_entire_input_buf) && (no_more_input_bytes_flag) && (!pState->m_flushed_compressor))
      {
         if (!pState->m_compressor.put_bytes(NULL, 0))
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = 0;

            pState->m_status = LZHAM_COMP_STATUS_FAILED;
            return pState->m_status;
         }  
         pState->m_flushed_compressor = true;  
      }
                  
      *pIn_buf_size = bytes_to_put;
      
      *pOut_buf_size = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);   
      if (*pOut_buf_size)
      {
         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, *pOut_buf_size);

         pState->m_comp_data_ofs += *pOut_buf_size;
      }
      
      if ((no_more_input_bytes_flag) && (pState->m_flushed_compressor) && (pState->m_comp_data_ofs >= comp_data.size()))
         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
      else if ((consumed_entire_input_buf) && (!no_more_input_bytes_flag) && (pState->m_comp_data_ofs >= comp_data.size()))
         pState->m_status = LZHAM_COMP_STATUS_NEEDS_MORE_INPUT;
      else
         pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
      
      return pState->m_status;  
   }